

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::RoaringScanState::Skip
          (RoaringScanState *this,ContainerScanState *scan_state,idx_t skip_count)

{
  if (scan_state->scanned_count + skip_count == scan_state->container_size) {
    scan_state->scanned_count = scan_state->container_size;
    return;
  }
  (*scan_state->_vptr_ContainerScanState[3])(scan_state,skip_count);
  return;
}

Assistant:

void RoaringScanState::Skip(ContainerScanState &scan_state, idx_t skip_count) {
	D_ASSERT(scan_state.scanned_count + skip_count <= scan_state.container_size);
	if (scan_state.scanned_count + skip_count == scan_state.container_size) {
		scan_state.scanned_count = scan_state.container_size;
		// This skips all remaining values covered by this container
		return;
	}
	scan_state.Skip(skip_count);
}